

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  QArrayData *pQVar4;
  int *piVar5;
  QArrayData *pQVar6;
  undefined8 uVar7;
  Data *pDVar8;
  XmlOutput *pXVar9;
  char *pcVar10;
  undefined4 in_register_00000034;
  storage_type *psVar11;
  QArrayData *pQVar12;
  QArrayData *pQVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QArrayData *local_918;
  QArrayData *local_8f8;
  QArrayData *local_8f0;
  xml_output local_8d0;
  undefined1 local_898 [8];
  undefined1 auStack_890 [16];
  undefined1 auStack_880 [16];
  undefined1 auStack_870 [16];
  undefined1 local_860 [8];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [8];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  xml_output local_7f0;
  undefined1 local_7b8 [16];
  Data *pDStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  Data *pDStack_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [8];
  undefined1 auStack_740 [16];
  undefined1 auStack_730 [16];
  undefined1 auStack_720 [16];
  undefined1 local_708 [8];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [8];
  undefined1 auStack_690 [16];
  undefined1 auStack_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  Data *pDStack_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  Data *pDStack_618;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  Data *pDStack_5e0;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  xml_output local_5b8;
  undefined1 local_580 [16];
  Data *pDStack_570;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [8];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  Data *pDStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  Data *pDStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  Data *pDStack_458;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [8];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  Data *pDStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  Data *pDStack_378;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  undefined1 auStack_230 [16];
  undefined1 auStack_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  Data *pDStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  undefined1 auStack_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [16];
  xml_output local_188;
  undefined1 local_150 [16];
  Data *pDStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  xml_output local_e0;
  xml_output local_a8;
  undefined1 local_70 [48];
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar14.m_data = (storage_type *)0x4;
  QVar14.m_size = (qsizetype)local_70;
  QString::fromUtf8(QVar14);
  local_70._24_8_ = local_70._16_8_;
  pQVar6 = (QArrayData *)CONCAT44(local_70._4_4_,local_70._0_4_);
  local_70._0_4_ = tTag;
  local_70._16_8_ = local_70._8_8_;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70._32_16_ = (undefined1  [16])0x0;
  local_40 = 0;
  local_70._8_8_ = pQVar6;
  pXVar9 = XmlOutput::operator<<
                     ((XmlOutput *)CONCAT44(in_register_00000034,__fd),(xml_output *)local_70);
  attrTagX(&local_a8,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar9 = XmlOutput::operator<<(pXVar9,&local_a8);
  attrTagX(&local_e0,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar9 = XmlOutput::operator<<(pXVar9,&local_e0);
  iVar2 = *(int *)((long)__buf + 0x194);
  if (iVar2 == -1) {
    local_118._0_4_ = tNothing;
    local_110 = (undefined1  [16])0x0;
    local_100 = (undefined1  [16])0x0;
    local_f0 = (undefined1  [16])0x0;
  }
  else {
    QVar15.m_data = (storage_type *)0x1c;
    QVar15.m_size = (qsizetype)local_118;
    QString::fromUtf8(QVar15);
    pQVar13 = (QArrayData *)CONCAT44(local_118._4_4_,local_118._0_4_);
    uVar7 = local_110._0_8_;
    local_100._0_8_ = local_110._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar16.m_data = psVar11;
    QVar16.m_size = (qsizetype)local_118;
    QString::fromUtf8(QVar16);
    local_f0 = local_110;
    local_100._8_8_ = CONCAT44(local_118._4_4_,local_118._0_4_);
    local_118._0_4_ = tTagValue;
    local_110._8_8_ = uVar7;
    local_110._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_100._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_100._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_100._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_100._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_100._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_100._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_100._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_118);
  if (*(long *)((long)__buf + 0x1c0) == 0) {
    local_150._0_4_ = tNothing;
    stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
  }
  else {
    QVar17.m_data = (storage_type *)0xe;
    QVar17.m_size = (qsizetype)local_150;
    QString::fromUtf8(QVar17);
    pQVar13 = (QArrayData *)CONCAT44(local_150._4_4_,local_150._0_4_);
    local_138._0_8_ = pDStack_140;
    local_150._0_4_ = tTagValue;
    pDStack_140 = (Data *)local_150._8_8_;
    local_150._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138._8_8_ = *(undefined8 *)((long)__buf + 0x1b0);
    local_128 = *(undefined1 (*) [16])((long)__buf + 0x1b8);
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_150);
  attrTagX(&local_188,"CPreprocessOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar9 = XmlOutput::operator<<(pXVar9,&local_188);
  iVar2 = *(int *)((long)__buf + 0x50);
  if (iVar2 == 2) {
    psVar11 = (storage_type *)0x5;
LAB_001fce51:
    QVar18.m_data = psVar11;
    QVar18.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar18);
    auStack_1a0 = auStack_1c0;
    local_8f0 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    if ((char16_t *)auStack_1c0._8_8_ == (char16_t *)0x0) goto LAB_001fcef9;
    QVar19.m_data = (storage_type *)0xf;
    QVar19.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar19);
    pQVar13 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    auStack_1b0._0_8_ = auStack_1c0._8_8_;
    local_1c8._0_4_ = tTagValue;
    auStack_1c0._8_8_ = auStack_1c0._0_8_;
    auStack_1c0._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_1b0._8_8_ = local_8f0;
    if (local_8f0 != (QArrayData *)0x0) {
      LOCK();
      (local_8f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_8f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar11 = (storage_type *)0x6;
      goto LAB_001fce51;
    }
    if (iVar2 == 0) {
      psVar11 = &DAT_00000008;
      goto LAB_001fce51;
    }
    local_8f0 = (QArrayData *)0x0;
LAB_001fcef9:
    local_1c8._0_4_ = tNothing;
    auStack_1c0 = (undefined1  [16])0x0;
    auStack_1b0 = (undefined1  [16])0x0;
    auStack_1a0 = (undefined1  [16])0x0;
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_1c8);
  if (*(long *)((long)__buf + 0x68) == 0) {
    local_200._0_4_ = tNothing;
    stack0xfffffffffffffe08 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
  }
  else {
    QVar20.m_data = (storage_type *)0xf;
    QVar20.m_size = (qsizetype)local_200;
    QString::fromUtf8(QVar20);
    pQVar13 = (QArrayData *)CONCAT44(local_200._4_4_,local_200._0_4_);
    local_1e8._0_8_ = pDStack_1f0;
    local_200._0_4_ = tTagValue;
    pDStack_1f0 = (Data *)local_200._8_8_;
    local_200._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8._8_8_ = *(undefined8 *)((long)__buf + 0x58);
    local_1d8 = *(undefined1 (*) [16])((long)__buf + 0x60);
    if ((int *)local_1e8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1e8._8_8_ = *(int *)local_1e8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_200);
  if (*(int *)((long)__buf + 0x70) == 2) {
    psVar11 = (storage_type *)0x3;
LAB_001fd044:
    QVar21.m_data = psVar11;
    QVar21.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar21);
    auStack_210 = auStack_230;
    local_8f8 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    if ((char16_t *)auStack_230._8_8_ == (char16_t *)0x0) goto LAB_001fd0ec;
    QVar22.m_data = (storage_type *)0x11;
    QVar22.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar22);
    pQVar13 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    auStack_220._0_8_ = auStack_230._8_8_;
    local_238._0_4_ = tTagValue;
    auStack_230._8_8_ = auStack_230._0_8_;
    auStack_230._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_220._8_8_ = local_8f8;
    if (local_8f8 != (QArrayData *)0x0) {
      LOCK();
      (local_8f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_8f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  else {
    if (*(int *)((long)__buf + 0x70) == 1) {
      psVar11 = (storage_type *)0x4;
      goto LAB_001fd044;
    }
    local_8f8 = (QArrayData *)0x0;
LAB_001fd0ec:
    local_238._0_4_ = tNothing;
    auStack_230 = (undefined1  [16])0x0;
    auStack_220 = (undefined1  [16])0x0;
    auStack_210 = (undefined1  [16])0x0;
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_238);
  iVar2 = *(int *)((long)__buf + 0x74);
  if (iVar2 == -1) {
    local_270._0_4_ = tNothing;
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
  }
  else {
    QVar23.m_data = (storage_type *)0x15;
    QVar23.m_size = (qsizetype)local_270;
    QString::fromUtf8(QVar23);
    pQVar13 = (QArrayData *)CONCAT44(local_270._4_4_,local_270._0_4_);
    uVar7 = local_268._0_8_;
    local_258._0_8_ = local_268._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar24.m_data = psVar11;
    QVar24.m_size = (qsizetype)local_270;
    QString::fromUtf8(QVar24);
    local_248 = local_268;
    local_258._8_8_ = CONCAT44(local_270._4_4_,local_270._0_4_);
    local_270._0_4_ = tTagValue;
    local_268._8_8_ = uVar7;
    local_268._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_258._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_258._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_270);
  iVar2 = *(int *)((long)__buf + 0x78);
  if (iVar2 == -1) {
    local_2a8._0_4_ = tNothing;
    local_2a0 = (undefined1  [16])0x0;
    local_290 = (undefined1  [16])0x0;
    local_280 = (undefined1  [16])0x0;
  }
  else {
    QVar25.m_data = (storage_type *)0x10;
    QVar25.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar25);
    pQVar13 = (QArrayData *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    uVar7 = local_2a0._0_8_;
    local_290._0_8_ = local_2a0._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar26.m_data = psVar11;
    QVar26.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar26);
    local_280 = local_2a0;
    local_290._8_8_ = CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    local_2a8._0_4_ = tTagValue;
    local_2a0._8_8_ = uVar7;
    local_2a0._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_290._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_290._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_290._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_290._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_290._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_290._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_290._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_2a8);
  iVar2 = *(int *)((long)__buf + 0x7c);
  if (iVar2 == -1) {
    local_2e0._0_4_ = tNothing;
    local_2d8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
  }
  else {
    QVar27.m_data = (storage_type *)0x13;
    QVar27.m_size = (qsizetype)local_2e0;
    QString::fromUtf8(QVar27);
    pQVar13 = (QArrayData *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
    uVar7 = local_2d8._0_8_;
    local_2c8._0_8_ = local_2d8._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar28.m_data = psVar11;
    QVar28.m_size = (qsizetype)local_2e0;
    QString::fromUtf8(QVar28);
    local_2b8 = local_2d8;
    local_2c8._8_8_ = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
    local_2e0._0_4_ = tTagValue;
    local_2d8._8_8_ = uVar7;
    local_2d8._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_2c8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_2c8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2c8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_2c8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2c8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_2c8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2c8._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_2e0);
  iVar2 = *(int *)((long)__buf + 0x80);
  if (iVar2 == -1) {
    local_318._0_4_ = tNothing;
    local_310 = (undefined1  [16])0x0;
    local_300 = (undefined1  [16])0x0;
    local_2f0 = (undefined1  [16])0x0;
  }
  else {
    QVar29.m_data = (storage_type *)0x15;
    QVar29.m_size = (qsizetype)local_318;
    QString::fromUtf8(QVar29);
    pQVar13 = (QArrayData *)CONCAT44(local_318._4_4_,local_318._0_4_);
    uVar7 = local_310._0_8_;
    local_300._0_8_ = local_310._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar30.m_data = psVar11;
    QVar30.m_size = (qsizetype)local_318;
    QString::fromUtf8(QVar30);
    local_2f0 = local_310;
    local_300._8_8_ = CONCAT44(local_318._4_4_,local_318._0_4_);
    local_318._0_4_ = tTagValue;
    local_310._8_8_ = uVar7;
    local_310._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_300._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_300._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_300._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_300._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_300._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_300._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_300._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_318);
  iVar2 = *(int *)((long)__buf + 0x84);
  if (iVar2 == -1) {
    local_350._0_4_ = tNothing;
    local_348 = (undefined1  [16])0x0;
    local_338 = (undefined1  [16])0x0;
    local_328 = (undefined1  [16])0x0;
  }
  else {
    QVar31.m_data = (storage_type *)0x12;
    QVar31.m_size = (qsizetype)local_350;
    QString::fromUtf8(QVar31);
    pQVar13 = (QArrayData *)CONCAT44(local_350._4_4_,local_350._0_4_);
    uVar7 = local_348._0_8_;
    local_338._0_8_ = local_348._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar32.m_data = psVar11;
    QVar32.m_size = (qsizetype)local_350;
    QString::fromUtf8(QVar32);
    local_328 = local_348;
    local_338._8_8_ = CONCAT44(local_350._4_4_,local_350._0_4_);
    local_350._0_4_ = tTagValue;
    local_348._8_8_ = uVar7;
    local_348._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_338._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_338._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_338._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_338._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_338._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_338._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_338._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_350);
  if (*(long *)((long)__buf + 0x1a8) == 0) {
    local_388._0_4_ = tNothing;
    stack0xfffffffffffffc80 = (undefined1  [16])0x0;
    local_370 = (undefined1  [16])0x0;
    local_360 = (undefined1  [16])0x0;
  }
  else {
    QVar33.m_data = (storage_type *)0x13;
    QVar33.m_size = (qsizetype)local_388;
    QString::fromUtf8(QVar33);
    pQVar13 = (QArrayData *)CONCAT44(local_388._4_4_,local_388._0_4_);
    local_370._0_8_ = pDStack_378;
    local_388._0_4_ = tTagValue;
    pDStack_378 = (Data *)local_388._8_8_;
    local_388._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_370._8_8_ = *(undefined8 *)((long)__buf + 0x198);
    local_360 = *(undefined1 (*) [16])((long)__buf + 0x1a0);
    if ((int *)local_370._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_370._8_8_ = *(int *)local_370._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_388);
  if (*(long *)((long)__buf + 0x1f8) == 0) {
    local_3c0._0_4_ = tNothing;
    stack0xfffffffffffffc48 = (undefined1  [16])0x0;
    local_3a8 = (undefined1  [16])0x0;
    local_398 = (undefined1  [16])0x0;
  }
  else {
    QVar34.m_data = (storage_type *)0x13;
    QVar34.m_size = (qsizetype)local_3c0;
    QString::fromUtf8(QVar34);
    pQVar13 = (QArrayData *)CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_3a8._0_8_ = pDStack_3b0;
    local_3c0._0_4_ = tTagValue;
    pDStack_3b0 = (Data *)local_3c0._8_8_;
    local_3c0._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3a8._8_8_ = *(undefined8 *)((long)__buf + 0x1e8);
    local_398 = *(undefined1 (*) [16])((long)__buf + 0x1f0);
    if ((int *)local_3a8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_3a8._8_8_ = *(int *)local_3a8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_3c0);
  iVar2 = *(int *)((long)__buf + 0xa0);
  if (iVar2 == -1) {
    local_3f8._0_4_ = tNothing;
    local_3f0 = (undefined1  [16])0x0;
    local_3e0 = (undefined1  [16])0x0;
    local_3d0 = (undefined1  [16])0x0;
  }
  else {
    QVar35.m_data = (storage_type *)0x17;
    QVar35.m_size = (qsizetype)local_3f8;
    QString::fromUtf8(QVar35);
    pQVar13 = (QArrayData *)CONCAT44(local_3f8._4_4_,local_3f8._0_4_);
    uVar7 = local_3f0._0_8_;
    local_3e0._0_8_ = local_3f0._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar36.m_data = psVar11;
    QVar36.m_size = (qsizetype)local_3f8;
    QString::fromUtf8(QVar36);
    local_3d0 = local_3f0;
    local_3e0._8_8_ = CONCAT44(local_3f8._4_4_,local_3f8._0_4_);
    local_3f8._0_4_ = tTagValue;
    local_3f0._8_8_ = uVar7;
    local_3f0._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_3e0._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_3e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_3e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_3e0._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_3f8);
  iVar2 = *(int *)((long)__buf + 0xa4);
  if (iVar2 == -1) {
    local_430._0_4_ = tNothing;
    local_428 = (undefined1  [16])0x0;
    local_418 = (undefined1  [16])0x0;
    local_408 = (undefined1  [16])0x0;
  }
  else {
    QVar37.m_data = (storage_type *)0x13;
    QVar37.m_size = (qsizetype)local_430;
    QString::fromUtf8(QVar37);
    pQVar13 = (QArrayData *)CONCAT44(local_430._4_4_,local_430._0_4_);
    uVar7 = local_428._0_8_;
    local_418._0_8_ = local_428._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar38.m_data = psVar11;
    QVar38.m_size = (qsizetype)local_430;
    QString::fromUtf8(QVar38);
    local_408 = local_428;
    local_418._8_8_ = CONCAT44(local_430._4_4_,local_430._0_4_);
    local_430._0_4_ = tTagValue;
    local_428._8_8_ = uVar7;
    local_428._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_418._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_418._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_418._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_418._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_418._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_418._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_418._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_430);
  if (*(long *)((long)__buf + 0xb8) == 0) {
    local_468._0_4_ = tNothing;
    stack0xfffffffffffffba0 = (undefined1  [16])0x0;
    local_450 = (undefined1  [16])0x0;
    local_440 = (undefined1  [16])0x0;
  }
  else {
    QVar39.m_data = (storage_type *)0xe;
    QVar39.m_size = (qsizetype)local_468;
    QString::fromUtf8(QVar39);
    pQVar13 = (QArrayData *)CONCAT44(local_468._4_4_,local_468._0_4_);
    local_450._0_8_ = pDStack_458;
    local_468._0_4_ = tTagValue;
    pDStack_458 = (Data *)local_468._8_8_;
    local_468._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_450._8_8_ = *(undefined8 *)((long)__buf + 0xa8);
    local_440 = *(undefined1 (*) [16])((long)__buf + 0xb0);
    if ((int *)local_450._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_450._8_8_ = *(int *)local_450._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_468);
  iVar2 = *(int *)((long)__buf + 0xc0);
  if (iVar2 == -1) {
    local_4a0._0_4_ = tNothing;
    local_498 = (undefined1  [16])0x0;
    local_488 = (undefined1  [16])0x0;
    local_478 = (undefined1  [16])0x0;
  }
  else {
    QVar40.m_data = (storage_type *)0x19;
    QVar40.m_size = (qsizetype)local_4a0;
    QString::fromUtf8(QVar40);
    pQVar13 = (QArrayData *)CONCAT44(local_4a0._4_4_,local_4a0._0_4_);
    uVar7 = local_498._0_8_;
    local_488._0_8_ = local_498._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar41.m_data = psVar11;
    QVar41.m_size = (qsizetype)local_4a0;
    QString::fromUtf8(QVar41);
    local_478 = local_498;
    local_488._8_8_ = CONCAT44(local_4a0._4_4_,local_4a0._0_4_);
    local_4a0._0_4_ = tTagValue;
    local_498._8_8_ = uVar7;
    local_498._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_488._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_488._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_488._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_488._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_488._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_488._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_488._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_4a0);
  if (*(long *)((long)__buf + 0xd8) == 0) {
    local_4d8._0_4_ = tNothing;
    stack0xfffffffffffffb30 = (undefined1  [16])0x0;
    local_4c0 = (undefined1  [16])0x0;
    local_4b0 = (undefined1  [16])0x0;
  }
  else {
    QVar42.m_data = (storage_type *)0x1b;
    QVar42.m_size = (qsizetype)local_4d8;
    QString::fromUtf8(QVar42);
    pQVar13 = (QArrayData *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_);
    local_4c0._0_8_ = pDStack_4c8;
    local_4d8._0_4_ = tTagValue;
    pDStack_4c8 = (Data *)local_4d8._8_8_;
    local_4d8._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4c0._8_8_ = *(undefined8 *)((long)__buf + 200);
    local_4b0 = *(undefined1 (*) [16])((long)__buf + 0xd0);
    if ((int *)local_4c0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_4c0._8_8_ = *(int *)local_4c0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_4d8);
  lVar3 = *(long *)((long)__buf + 0x218);
  if (lVar3 == -1) {
    local_510._0_4_ = tNothing;
    stack0xfffffffffffffaf8 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    local_4e8 = (undefined1  [16])0x0;
  }
  else {
    QVar43.m_data = &DAT_00000008;
    QVar43.m_size = (qsizetype)local_510;
    QString::fromUtf8(QVar43);
    pQVar13 = (QArrayData *)CONCAT44(local_510._4_4_,local_510._0_4_);
    pDVar8 = pDStack_500;
    QString::number((longlong)local_548,(int)lVar3);
    local_510._0_4_ = tTagValue;
    pDStack_500 = (Data *)local_510._8_8_;
    local_510._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4f8._8_8_ = CONCAT44(local_548._4_4_,local_548._0_4_);
    local_4f8._0_8_ = pDVar8;
    local_4e8 = local_540;
    if ((int *)local_4f8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_4f8._8_8_ = *(int *)local_4f8._8_8_ + 1;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_548._4_4_,local_548._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_548._4_4_,local_548._0_4_),2,0x10);
        }
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_510);
  iVar2 = *(int *)((long)__buf + 0xe0);
  if (iVar2 == -1) {
    local_548._0_4_ = tNothing;
    local_540 = (undefined1  [16])0x0;
    local_530 = (undefined1  [16])0x0;
    local_520 = (undefined1  [16])0x0;
  }
  else {
    QVar44.m_data = (storage_type *)0x12;
    QVar44.m_size = (qsizetype)local_548;
    QString::fromUtf8(QVar44);
    pQVar13 = (QArrayData *)CONCAT44(local_548._4_4_,local_548._0_4_);
    uVar7 = local_540._0_8_;
    local_530._0_8_ = local_540._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar45.m_data = psVar11;
    QVar45.m_size = (qsizetype)local_548;
    QString::fromUtf8(QVar45);
    local_520 = local_540;
    local_530._8_8_ = CONCAT44(local_548._4_4_,local_548._0_4_);
    local_548._0_4_ = tTagValue;
    local_540._8_8_ = uVar7;
    local_540._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_530._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_530._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_530._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_530._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_530._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_530._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_530._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_548);
  if (*(long *)((long)__buf + 0xf8) == 0) {
    local_580._0_4_ = tNothing;
    stack0xfffffffffffffa88 = (undefined1  [16])0x0;
    local_568 = (undefined1  [16])0x0;
    local_558 = (undefined1  [16])0x0;
  }
  else {
    QVar46.m_data = (storage_type *)0xf;
    QVar46.m_size = (qsizetype)local_580;
    QString::fromUtf8(QVar46);
    pQVar13 = (QArrayData *)CONCAT44(local_580._4_4_,local_580._0_4_);
    local_568._0_8_ = pDStack_570;
    local_580._0_4_ = tTagValue;
    pDStack_570 = (Data *)local_580._8_8_;
    local_580._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_568._8_8_ = *(undefined8 *)((long)__buf + 0xe8);
    local_558 = *(undefined1 (*) [16])((long)__buf + 0xf0);
    if ((int *)local_568._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_568._8_8_ = *(int *)local_568._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_580);
  attrTagX(&local_5b8,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x100),";");
  pXVar9 = XmlOutput::operator<<(pXVar9,&local_5b8);
  if (*(long *)((long)__buf + 0x128) == 0) {
    local_5f0._0_4_ = tNothing;
    stack0xfffffffffffffa18 = (undefined1  [16])0x0;
    local_5d8 = (undefined1  [16])0x0;
    local_5c8 = (undefined1  [16])0x0;
  }
  else {
    QVar47.m_data = (storage_type *)0xd;
    QVar47.m_size = (qsizetype)local_5f0;
    QString::fromUtf8(QVar47);
    pQVar13 = (QArrayData *)CONCAT44(local_5f0._4_4_,local_5f0._0_4_);
    local_5d8._0_8_ = pDStack_5e0;
    local_5f0._0_4_ = tTagValue;
    pDStack_5e0 = (Data *)local_5f0._8_8_;
    local_5f0._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_5d8._8_8_ = *(undefined8 *)((long)__buf + 0x118);
    local_5c8 = *(undefined1 (*) [16])((long)__buf + 0x120);
    if ((int *)local_5d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_5d8._8_8_ = *(int *)local_5d8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_5f0);
  if (*(long *)((long)__buf + 0x140) == 0) {
    local_628._0_4_ = tNothing;
    stack0xfffffffffffff9e0 = (undefined1  [16])0x0;
    local_610 = (undefined1  [16])0x0;
    local_600 = (undefined1  [16])0x0;
  }
  else {
    QVar48.m_data = (storage_type *)0x17;
    QVar48.m_size = (qsizetype)local_628;
    QString::fromUtf8(QVar48);
    pQVar13 = (QArrayData *)CONCAT44(local_628._4_4_,local_628._0_4_);
    local_610._0_8_ = pDStack_618;
    local_628._0_4_ = tTagValue;
    pDStack_618 = (Data *)local_628._8_8_;
    local_628._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_610._8_8_ = *(undefined8 *)((long)__buf + 0x130);
    local_600 = *(undefined1 (*) [16])((long)__buf + 0x138);
    if ((int *)local_610._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_610._8_8_ = *(int *)local_610._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_628);
  if (*(long *)((long)__buf + 0x210) == 0) {
    local_660._0_4_ = tNothing;
    stack0xfffffffffffff9a8 = (undefined1  [16])0x0;
    local_648 = (undefined1  [16])0x0;
    local_638 = (undefined1  [16])0x0;
  }
  else {
    QVar49.m_data = (storage_type *)0xe;
    QVar49.m_size = (qsizetype)local_660;
    QString::fromUtf8(QVar49);
    pQVar13 = (QArrayData *)CONCAT44(local_660._4_4_,local_660._0_4_);
    local_648._0_8_ = pDStack_650;
    local_660._0_4_ = tTagValue;
    pDStack_650 = (Data *)local_660._8_8_;
    local_660._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_648._8_8_ = *(undefined8 *)((long)__buf + 0x200);
    local_638 = *(undefined1 (*) [16])((long)__buf + 0x208);
    if ((int *)local_648._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_660);
  switch(*(undefined4 *)((long)__buf + 0x148)) {
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    psVar11 = (storage_type *)0x2;
    goto LAB_001fe481;
  default:
    local_918 = (QArrayData *)0x0;
    goto LAB_001fe528;
  }
  psVar11 = (storage_type *)0x1;
LAB_001fe481:
  QVar50.m_data = psVar11;
  QVar50.m_size = (qsizetype)local_698;
  QString::fromUtf8(QVar50);
  auStack_670 = auStack_690;
  local_918 = (QArrayData *)CONCAT44(local_698._4_4_,local_698._0_4_);
  if ((char16_t *)auStack_690._8_8_ == (char16_t *)0x0) {
LAB_001fe528:
    local_698._0_4_ = tNothing;
    auStack_690 = (undefined1  [16])0x0;
    auStack_680 = (undefined1  [16])0x0;
    auStack_670 = (undefined1  [16])0x0;
  }
  else {
    QVar51.m_data = (storage_type *)0x15;
    QVar51.m_size = (qsizetype)local_698;
    QString::fromUtf8(QVar51);
    pQVar13 = (QArrayData *)CONCAT44(local_698._4_4_,local_698._0_4_);
    auStack_680._0_8_ = auStack_690._8_8_;
    local_698._0_4_ = tTagValue;
    auStack_690._8_8_ = auStack_690._0_8_;
    auStack_690._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_680._8_8_ = local_918;
    if (local_918 != (QArrayData *)0x0) {
      LOCK();
      (local_918->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_918->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_698);
  iVar2 = *(int *)((long)__buf + 0x1e4);
  if (iVar2 == -1) {
    local_6d0._0_4_ = tNothing;
    local_6c8 = (undefined1  [16])0x0;
    local_6b8 = (undefined1  [16])0x0;
    local_6a8 = (undefined1  [16])0x0;
  }
  else {
    QVar52.m_data = (storage_type *)0x18;
    QVar52.m_size = (qsizetype)local_6d0;
    QString::fromUtf8(QVar52);
    pQVar13 = (QArrayData *)CONCAT44(local_6d0._4_4_,local_6d0._0_4_);
    uVar7 = local_6c8._0_8_;
    local_6b8._0_8_ = local_6c8._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar53.m_data = psVar11;
    QVar53.m_size = (qsizetype)local_6d0;
    QString::fromUtf8(QVar53);
    local_6a8 = local_6c8;
    local_6b8._8_8_ = CONCAT44(local_6d0._4_4_,local_6d0._0_4_);
    local_6d0._0_4_ = tTagValue;
    local_6c8._8_8_ = uVar7;
    local_6c8._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_6b8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_6b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_6b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_6b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_6b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_6b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_6b8._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_6d0);
  iVar2 = *(int *)((long)__buf + 0x14c);
  if (iVar2 == -1) {
    local_708._0_4_ = tNothing;
    local_700 = (undefined1  [16])0x0;
    local_6f0 = (undefined1  [16])0x0;
    local_6e0 = (undefined1  [16])0x0;
  }
  else {
    QVar54.m_data = (storage_type *)0x15;
    QVar54.m_size = (qsizetype)local_708;
    QString::fromUtf8(QVar54);
    pQVar13 = (QArrayData *)CONCAT44(local_708._4_4_,local_708._0_4_);
    uVar7 = local_700._0_8_;
    local_6f0._0_8_ = local_700._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar55.m_data = psVar11;
    QVar55.m_size = (qsizetype)local_708;
    QString::fromUtf8(QVar55);
    local_6e0 = local_700;
    local_6f0._8_8_ = CONCAT44(local_708._4_4_,local_708._0_4_);
    local_708._0_4_ = tTagValue;
    local_700._8_8_ = uVar7;
    local_700._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_6f0._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_6f0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_6f0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_6f0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_6f0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_6f0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_6f0._8_8_,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_708);
  if (*(int *)((long)__buf + 0x150) == 2) {
    psVar11 = (storage_type *)0x3;
LAB_001fe809:
    QVar56.m_data = psVar11;
    QVar56.m_size = (qsizetype)local_748;
    QString::fromUtf8(QVar56);
    auStack_720 = auStack_740;
    pQVar13 = (QArrayData *)CONCAT44(local_748._4_4_,local_748._0_4_);
    if ((char16_t *)auStack_740._8_8_ == (char16_t *)0x0) goto LAB_001fe8a9;
    QVar57.m_data = (storage_type *)0x11;
    QVar57.m_size = (qsizetype)local_748;
    QString::fromUtf8(QVar57);
    pQVar12 = (QArrayData *)CONCAT44(local_748._4_4_,local_748._0_4_);
    auStack_730._0_8_ = auStack_740._8_8_;
    local_748._0_4_ = tTagValue;
    auStack_740._8_8_ = auStack_740._0_8_;
    auStack_740._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_730._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  else {
    if (*(int *)((long)__buf + 0x150) == 1) {
      psVar11 = (storage_type *)0x5;
      goto LAB_001fe809;
    }
    pQVar13 = (QArrayData *)0x0;
LAB_001fe8a9:
    local_748._0_4_ = tNothing;
    auStack_740 = (undefined1  [16])0x0;
    auStack_730 = (undefined1  [16])0x0;
    auStack_720 = (undefined1  [16])0x0;
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_748);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_780._0_4_ = tNothing;
    stack0xfffffffffffff888 = (undefined1  [16])0x0;
    local_768 = (undefined1  [16])0x0;
    local_758 = (undefined1  [16])0x0;
  }
  else {
    QVar58.m_data = (storage_type *)0xd;
    QVar58.m_size = (qsizetype)local_780;
    QString::fromUtf8(QVar58);
    pQVar12 = (QArrayData *)CONCAT44(local_780._4_4_,local_780._0_4_);
    local_768._0_8_ = pDStack_770;
    local_780._0_4_ = tTagValue;
    pDStack_770 = (Data *)local_780._8_8_;
    local_780._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_768._8_8_ = *(undefined8 *)((long)__buf + 0x1c8);
    local_758 = *(undefined1 (*) [16])((long)__buf + 0x1d0);
    if ((int *)local_768._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_768._8_8_ = *(int *)local_768._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_780);
  if (*(long *)((long)__buf + 0x168) == 0) {
    local_7b8._0_4_ = tNothing;
    stack0xfffffffffffff850 = (undefined1  [16])0x0;
    local_7a0 = (undefined1  [16])0x0;
    local_790 = (undefined1  [16])0x0;
  }
  else {
    QVar59.m_data = (storage_type *)0xf;
    QVar59.m_size = (qsizetype)local_7b8;
    QString::fromUtf8(QVar59);
    pQVar12 = (QArrayData *)CONCAT44(local_7b8._4_4_,local_7b8._0_4_);
    local_7a0._0_8_ = pDStack_7a8;
    local_7b8._0_4_ = tTagValue;
    pDStack_7a8 = (Data *)local_7b8._8_8_;
    local_7b8._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_7a0._8_8_ = *(undefined8 *)((long)__buf + 0x158);
    local_790 = *(undefined1 (*) [16])((long)__buf + 0x160);
    if ((int *)local_7a0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_7a0._8_8_ = *(int *)local_7a0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_7b8);
  attrTagX(&local_7f0,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x170),";");
  pXVar9 = XmlOutput::operator<<(pXVar9,&local_7f0);
  iVar2 = *(int *)((long)__buf + 0x1e0);
  if (iVar2 == -1) {
    local_828._0_4_ = tNothing;
    local_820 = (undefined1  [16])0x0;
    local_810 = (undefined1  [16])0x0;
    local_800 = (undefined1  [16])0x0;
  }
  else {
    QVar60.m_data = (storage_type *)0x15;
    QVar60.m_size = (qsizetype)local_828;
    QString::fromUtf8(QVar60);
    pQVar12 = (QArrayData *)CONCAT44(local_828._4_4_,local_828._0_4_);
    uVar7 = local_820._0_8_;
    local_810._0_8_ = local_820._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar61.m_data = psVar11;
    QVar61.m_size = (qsizetype)local_828;
    QString::fromUtf8(QVar61);
    local_800 = local_820;
    local_810._8_8_ = CONCAT44(local_828._4_4_,local_828._0_4_);
    local_828._0_4_ = tTagValue;
    local_820._8_8_ = uVar7;
    local_820._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_810._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_810._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_810._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_810._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_810._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_810._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_810._8_8_,2,0x10);
      }
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_828);
  iVar2 = *(int *)((long)__buf + 0x18c);
  if (iVar2 == -1) {
    local_860._0_4_ = tNothing;
    local_858 = (undefined1  [16])0x0;
    local_848 = (undefined1  [16])0x0;
    local_838 = (undefined1  [16])0x0;
  }
  else {
    QVar62.m_data = (storage_type *)0xb;
    QVar62.m_size = (qsizetype)local_860;
    QString::fromUtf8(QVar62);
    pQVar12 = (QArrayData *)CONCAT44(local_860._4_4_,local_860._0_4_);
    uVar7 = local_858._0_8_;
    local_848._0_8_ = local_858._8_8_;
    pcVar10 = "false";
    if (iVar2 == 1) {
      pcVar10 = "true";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar11 + (long)(pcVar10 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar63.m_data = psVar11;
    QVar63.m_size = (qsizetype)local_860;
    QString::fromUtf8(QVar63);
    local_838 = local_858;
    local_848._8_8_ = CONCAT44(local_860._4_4_,local_860._0_4_);
    local_860._0_4_ = tTagValue;
    local_858._8_8_ = uVar7;
    local_858._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_848._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_848._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_848._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_848._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_848._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_848._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_848._8_8_,2,0x10);
      }
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_860);
  switch(*(undefined4 *)((long)__buf + 400)) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    pQVar12 = (QArrayData *)0x0;
    goto LAB_001fee38;
  }
  QVar64.m_data = (storage_type *)0x1;
  QVar64.m_size = (qsizetype)local_898;
  QString::fromUtf8(QVar64);
  auStack_870 = auStack_890;
  pQVar12 = (QArrayData *)CONCAT44(local_898._4_4_,local_898._0_4_);
  if ((char16_t *)auStack_890._8_8_ == (char16_t *)0x0) {
LAB_001fee38:
    local_898._0_4_ = tNothing;
    auStack_890 = (undefined1  [16])0x0;
    auStack_880 = (undefined1  [16])0x0;
    auStack_870 = (undefined1  [16])0x0;
  }
  else {
    QVar65.m_data = &DAT_0000000c;
    QVar65.m_size = (qsizetype)local_898;
    QString::fromUtf8(QVar65);
    pQVar4 = (QArrayData *)CONCAT44(local_898._4_4_,local_898._0_4_);
    auStack_880._0_8_ = auStack_890._8_8_;
    local_898._0_4_ = tTagValue;
    auStack_890._8_8_ = auStack_890._0_8_;
    auStack_890._0_8_ = pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_880._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar9 = XmlOutput::operator<<(pXVar9,(xml_output *)local_898);
  QVar66.m_data = (storage_type *)0x4;
  QVar66.m_size = (qsizetype)&local_8d0;
  QString::fromUtf8(QVar66);
  local_8d0.xo_text.d.size = (qsizetype)local_8d0.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_8d0._4_4_,local_8d0.xo_type);
  local_8d0.xo_type = tCloseTag;
  local_8d0.xo_text.d.ptr = (char16_t *)local_8d0.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_8d0.xo_value.d.d = (Data *)0x0;
  local_8d0.xo_value.d.ptr = (char16_t *)0x0;
  local_8d0.xo_value.d.size = 0;
  local_8d0.xo_text.d.d = (Data *)pQVar4;
  XmlOutput::operator<<(pXVar9,&local_8d0);
  if (&(local_8d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if ((QArrayData *)auStack_880._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_880._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_890._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_890._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_890._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_890._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_890._0_8_,2,0x10);
    }
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if ((QArrayData *)local_848._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_848._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_848._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_848._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_848._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_858._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_858._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_858._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_858._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_858._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_810._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_810._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_810._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_810._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_810._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_820._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_820._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_820._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_820._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_820._0_8_,2,0x10);
    }
  }
  if (&(local_7f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_7a0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7a0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_7b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7b8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_768._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_768._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_780._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_780._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_730._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_730._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_740._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_740._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_740._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_740._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_740._0_8_,2,0x10);
    }
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  if ((QArrayData *)local_6f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_6f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_6f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_6f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_6f0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_700._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_700._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_700._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_700._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_700._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_6b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_6b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_6b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_6b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_6b8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_6c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_6c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_6c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_6c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_6c8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_680._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_680._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_690._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_690._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_690._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_690._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_690._0_8_,2,0x10);
    }
  }
  if (local_918 != (QArrayData *)0x0) {
    LOCK();
    (local_918->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_918->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_918->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_918,2,0x10);
    }
  }
  if ((QArrayData *)local_648._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_648._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_660._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_660._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_610._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_610._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_628._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_628._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_5d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5d8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_5f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5f0._8_8_,2,0x10);
    }
  }
  if (&(local_5b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_568._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_568._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_580._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_580._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_530._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_530._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_540._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_540._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_540._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_540._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_540._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4f8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4f8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_510._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_510._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4d8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_488._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_488._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_498._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_498._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_498._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_498._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_498._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_450._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_450._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_468._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_468._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_418._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_418._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_418._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_418._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_418._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_428._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_428._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_428._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_428._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_428._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3e0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3e0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3e0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3e0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3e0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3f0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3f0._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3a8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3a8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_370._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_370._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_388._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_388._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_338._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_338._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_338._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_338._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_338._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_348._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_348._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_348._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_348._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_348._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_300._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_300._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_300._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_300._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_300._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_310._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_310._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_310._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_310._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_310._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_2c8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2c8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2c8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2c8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_2d8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_290._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_290._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_290._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_290._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_290._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_2a0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2a0._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_258._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_258._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_268._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_220._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_220._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_230._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_230._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_230._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_230._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_230._0_8_,2,0x10);
    }
  }
  if (local_8f8 != (QArrayData *)0x0) {
    LOCK();
    (local_8f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_8f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_8f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_8f8,2,0x10);
    }
  }
  if ((QArrayData *)local_1e8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1e8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_200._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_200._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1b0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1b0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1c0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1c0._0_8_,2,0x10);
    }
  }
  if (local_8f0 != (QArrayData *)0x0) {
    LOCK();
    (local_8f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_8f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_8f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_8f0,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_138._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_138._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_150._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_150._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_100._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_100._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_110._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_110._0_8_,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_70._32_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._32_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_70._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._8_8_,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCMIDLTool &tool)
{
    xml
        << tag(_Midl)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagT(_ApplicationConfigurationMode, tool.ApplicationConfigurationMode)
            << attrTagS(_ClientStubFile, tool.ClientStubFile)
            << attrTagX(_CPreprocessOptions, tool.CPreprocessOptions, " ")
            << attrTagS(_DefaultCharType, toString(tool.DefaultCharType))
            << attrTagS(_DLLDataFileName, tool.DLLDataFileName)
            << attrTagS(_EnableErrorChecks, toString(tool.EnableErrorChecks))
            << attrTagT(_ErrorCheckAllocations, tool.ErrorCheckAllocations)
            << attrTagT(_ErrorCheckBounds, tool.ErrorCheckBounds)
            << attrTagT(_ErrorCheckEnumRange, tool.ErrorCheckEnumRange)
            << attrTagT(_ErrorCheckRefPointers, tool.ErrorCheckRefPointers)
            << attrTagT(_ErrorCheckStubData, tool.ErrorCheckStubData)
            << attrTagS(_GenerateClientFiles, tool.GenerateClientFiles)
            << attrTagS(_GenerateServerFiles, tool.GenerateServerFiles)
            << attrTagT(_GenerateStublessProxies, tool.GenerateStublessProxies)
            << attrTagT(_GenerateTypeLibrary, tool.GenerateTypeLibrary)
            << attrTagS(_HeaderFileName, tool.HeaderFileName)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InterfaceIdentifierFileName, tool.InterfaceIdentifierFileName)
            << attrTagL(_LocaleID, tool.LocaleID, /*ifNot*/ -1)
            << attrTagT(_MkTypLibCompatible, tool.MkTypLibCompatible)
            << attrTagS(_OutputDirectory, tool.OutputDirectory)
            << attrTagX(_PreprocessorDefinitions, tool.PreprocessorDefinitions, ";")
            << attrTagS(_ProxyFileName, tool.ProxyFileName)
            << attrTagS(_RedirectOutputAndErrors, tool.RedirectOutputAndErrors)
            << attrTagS(_ServerStubFile, tool.ServerStubFile)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressCompilerWarnings, tool.SuppressCompilerWarnings)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagS(_TargetEnvironment, toString(tool.TargetEnvironment))
            << attrTagS(_TypeLibFormat, tool.TypeLibFormat)
            << attrTagS(_TypeLibraryName, tool.TypeLibraryName)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_ValidateAllParameters, tool.ValidateAllParameters)
            << attrTagT(_WarnAsError, tool.WarnAsError)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
        << closetag(_Midl);
}